

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
ElementsTransactionApi_FundRawTransaction_Reissueasset_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_Reissueasset_Test *this)

{
  pointer *ppuVar1;
  pointer pTVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  pointer pTVar7;
  initializer_list<cfd::api::ElementsUtxoAndOption> __l;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  ElementsTransactionApi api;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  string tokenAsset;
  UtxoFilter filter;
  ElementsAddressFactory factory;
  string descMulti;
  ConfidentialTransactionController ctx;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  ConfidentialAssetId fee_asset;
  Amount estimate_fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  ExtPubkey key;
  Address set_addr1;
  Address addr1;
  Address set_addr2;
  ConfidentialTransactionContext tx;
  Address addr2;
  IssuanceOutputParameter reissue_data;
  Address addr;
  ElementsUtxoAndOption input_utxo;
  undefined4 in_stack_ffffffffffffe6bc;
  undefined4 in_stack_ffffffffffffe6e4;
  AssertHelper local_18f8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18f0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18e8;
  Message local_18e0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18d8;
  undefined1 local_18d0 [23];
  vector local_18b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18b8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1898;
  undefined1 *local_1878 [2];
  undefined1 local_1868 [20];
  vector local_1854 [4];
  undefined **local_1850 [2];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  local_1840 [24];
  undefined1 *local_1828 [2];
  undefined1 local_1818 [16];
  undefined1 local_1808 [80];
  undefined1 local_17b8 [24];
  ConfidentialAssetId local_17a0;
  Amount local_1778 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  local_1768;
  undefined1 local_1738 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1728;
  uchar local_1718 [8];
  void *local_1710;
  void *local_1708;
  undefined **local_1700;
  void *local_16f8;
  void *local_16f0;
  void *local_16e0;
  void *local_16d8;
  code *local_16c0 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1648;
  Script local_1630;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_15f0 [19];
  undefined8 local_1248;
  Script local_1240;
  uint32_t local_1208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1200;
  ExtPubkey local_11d0;
  undefined1 local_1160 [40];
  void *local_1138;
  undefined **local_1118;
  void *local_1110;
  BlindFactor local_10f0;
  uchar local_10d0 [16];
  void *local_10c0;
  void *local_10a8;
  void *local_1090;
  code *local_1078 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1000;
  Script local_fe8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_fa8;
  Pubkey local_f78;
  uchar local_f58 [16];
  void *local_f48;
  void *local_f30;
  void *local_f18;
  code *local_f00 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_e88;
  Script local_e70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e30;
  Pubkey local_e00;
  uchar local_de0 [16];
  void *local_dd0;
  void *local_db8;
  void *local_da0;
  code *local_d88 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_d10;
  Script local_cf8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cb8;
  ConfidentialTransactionContext local_c88 [184];
  Pubkey local_bd0;
  uchar local_bb0 [16];
  void *local_ba0;
  void *local_b88;
  void *local_b70;
  code *local_b58 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_ae0;
  Script local_ac8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a88;
  undefined1 local_a58 [16];
  _func_int *local_a48 [45];
  ElementsConfidentialAddress local_8e0 [432];
  Script local_730;
  undefined1 local_6f8 [16];
  bool local_6e8;
  string local_6e0 [16];
  undefined1 *local_6d0;
  undefined1 local_6c0 [16];
  void *local_6b0;
  void *local_698;
  void *local_680;
  code *local_668 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_5f0;
  Script local_5d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_598;
  UtxoData local_568 [40];
  Txid local_540;
  uint local_520;
  string local_330 [32];
  _func_int **local_310;
  UtxoData local_308;
  undefined4 local_300;
  undefined8 local_2f8;
  ConfidentialAssetId local_2f0 [11];
  BlindFactor local_118;
  BlindFactor local_f8 [4];
  undefined2 local_78;
  undefined1 uStack_76;
  undefined1 uStack_75;
  uint32_t uStack_74;
  Script local_70;
  uint32_t local_38;
  
  cfd::UtxoData::UtxoData(local_568);
  local_78 = 0;
  uStack_76 = 0;
  uStack_74 = 0;
  cfd::core::Script::Script(&local_70);
  local_38 = 0;
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_c88,2,0);
  local_1898.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1898.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1898.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)local_1850,kElementsRegtest);
  local_1878[0] = local_1868;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1878,"ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b"
             ,"");
  local_1828[0] = local_1818;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1828,
             "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))"
             ,"");
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (&local_1898,
             ((long)kFundCoinSelectElementsTestVector.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)kFundCoinSelectElementsTestVector.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  pTVar2 = kFundCoinSelectElementsTestVector.
           super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (kFundCoinSelectElementsTestVector.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      kFundCoinSelectElementsTestVector.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar5 = 0;
    pTVar7 = kFundCoinSelectElementsTestVector.
             super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid((Txid *)local_a58);
      if ((pTVar7->txid)._M_string_length != 0) {
        cfd::core::Txid::Txid((Txid *)local_1738,(string *)pTVar7);
        cfd::core::Txid::operator=((Txid *)local_a58,(Txid *)local_1738);
        local_1738._0_8_ = &PTR__Txid_002dbe60;
        if ((void *)CONCAT71(local_1738._9_7_,local_1738[8]) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_1738._9_7_,local_1738[8]));
        }
      }
      cfd::core::Txid::Txid((Txid *)local_1738,(string *)pTVar7);
      lVar4 = uVar5 * 0x4f0;
      cfd::core::Txid::operator=
                ((Txid *)(local_1898.
                          super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar4 + 0x28),(Txid *)local_1738);
      local_1738._0_8_ = &PTR__Txid_002dbe60;
      if ((void *)CONCAT71(local_1738._9_7_,local_1738[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_1738._9_7_,local_1738[8]));
      }
      *(uint32_t *)
       (local_1898.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
        super__Vector_impl_data._M_start + lVar4 + 0x48) = pTVar7->vout;
      cfd::core::Amount::Amount((Amount *)local_1738,pTVar7->amount);
      local_1898.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4 + 0x260] = local_1738[8];
      *(undefined8 *)
       (local_1898.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
        super__Vector_impl_data._M_start + lVar4 + 600) = local_1738._0_8_;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_1738,(string *)&pTVar7->asset);
      cfd::core::ConfidentialAssetId::operator=
                ((ConfidentialAssetId *)
                 (local_1898.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar4 + 0x278),
                 (ConfidentialAssetId *)local_1738);
      local_1738._0_8_ = &PTR__ConfidentialAssetId_002dc170;
      if ((void *)CONCAT71(local_1738._9_7_,local_1738[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_1738._9_7_,local_1738[8]));
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 (local_1898.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar4 + 0x238));
      local_a58._0_8_ = &PTR__Txid_002dbe60;
      if ((pointer)local_a58._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a58._8_8_);
      }
      pTVar7 = pTVar7 + 1;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (pTVar7 != pTVar2);
  }
  local_78 = 0x101;
  local_a58._0_8_ = local_a48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a58,"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",
             "");
  cfd::core::Txid::Txid((Txid *)local_1738,(string *)local_a58);
  cfd::core::Txid::operator=(&local_540,(Txid *)local_1738);
  local_1738._0_8_ = &PTR__Txid_002dbe60;
  if ((void *)CONCAT71(local_1738._9_7_,local_1738[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1738._9_7_,local_1738[8]));
  }
  if ((_func_int **)local_a58._0_8_ != local_a48) {
    operator_delete((void *)local_a58._0_8_);
  }
  local_520 = 1;
  std::__cxx11::string::_M_assign(local_330);
  local_2f8 = 0;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1738,(string *)local_1878);
  cfd::core::ConfidentialAssetId::operator=(local_2f0,(ConfidentialAssetId *)local_1738);
  local_1738._0_8_ = &PTR__ConfidentialAssetId_002dc170;
  if ((void *)CONCAT71(local_1738._9_7_,local_1738[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1738._9_7_,local_1738[8]));
  }
  local_a58._0_8_ = local_a48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a58,"0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8",
             "");
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_1738,(string *)local_a58);
  cfd::core::BlindFactor::operator=(&local_118,(BlindFactor *)local_1738);
  local_1738._0_8_ = &PTR__BlindFactor_002dbf10;
  if ((void *)CONCAT71(local_1738._9_7_,local_1738[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1738._9_7_,local_1738[8]));
  }
  if ((_func_int **)local_a58._0_8_ != local_a48) {
    operator_delete((void *)local_a58._0_8_);
  }
  local_a58._0_8_ = local_a48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a58,"62e36e1f0fa4916b031648a6b6903083069fa587572a88b729250cde528cfd3b",
             "");
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_1738,(string *)local_a58);
  cfd::core::BlindFactor::operator=(local_f8,(BlindFactor *)local_1738);
  local_1738._0_8_ = &PTR__BlindFactor_002dbf10;
  if ((void *)CONCAT71(local_1738._9_7_,local_1738[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1738._9_7_,local_1738[8]));
  }
  if ((_func_int **)local_a58._0_8_ != local_a48) {
    operator_delete((void *)local_a58._0_8_);
  }
  cfd::core::Amount::Amount((Amount *)local_1738,700000000);
  local_308 = local_1738[8];
  local_310 = (_func_int **)local_1738._0_8_;
  local_300 = 3;
  cfd::ConfidentialTransactionContext::AddInput((UtxoData *)local_c88);
  local_1738._0_8_ = &local_1728;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1738,"2djHX9wtrtdyGw9cer1u6zB6Yq4SRD8V5zw","");
  cfd::AddressFactory::GetAddress(local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._0_8_ != &local_1728) {
    operator_delete((void *)local_1738._0_8_);
  }
  cfd::core::Amount::Amount((Amount *)local_a58,700000000);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1738,(string *)local_1878);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_c88,(Amount *)local_6e0,(ConfidentialAssetId *)local_a58);
  local_1738._0_8_ = &PTR__ConfidentialAssetId_002dc170;
  if ((void *)CONCAT71(local_1738._9_7_,local_1738[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1738._9_7_,local_1738[8]));
  }
  cfd::core::Address::Address((Address *)local_a58);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_8e0);
  cfd::core::Script::Script(&local_730);
  cfd::core::Amount::Amount((Amount *)local_6f8);
  local_6e8 = false;
  ppuVar1 = (pointer *)
            ((long)&local_10f0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_10f0._vptr_BlindFactor = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_10f0,"2dodsWJgP3pTWWidK5hDxuYHqC1U4CEnT3n","");
  cfd::AddressFactory::GetAddress((string *)local_1738);
  cfd::core::Address::operator=((Address *)local_a58,(Address *)local_1738);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_15f0);
  cfd::core::Script::~Script(&local_1630);
  local_16c0[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1648)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_16c0);
  if (local_16d8 != (void *)0x0) {
    operator_delete(local_16d8);
  }
  if (local_16f0 != (void *)0x0) {
    operator_delete(local_16f0);
  }
  if (local_1708 != (void *)0x0) {
    operator_delete(local_1708);
  }
  if ((uchar *)local_1728._M_allocated_capacity != local_1718) {
    operator_delete((void *)local_1728._M_allocated_capacity);
  }
  if (local_10f0._vptr_BlindFactor != (_func_int **)ppuVar1) {
    operator_delete(local_10f0._vptr_BlindFactor);
  }
  cfd::core::Amount::Amount((Amount *)local_1738,600000000);
  local_6f8[8] = local_1738[8];
  local_6f8._0_8_ = local_1738._0_8_;
  cfd::core::OutPoint::OutPoint((OutPoint *)local_1738,&local_540,local_520);
  ppuVar1 = (pointer *)
            ((long)&local_e00.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 0x10);
  local_e00.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e00,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306"
             ,"");
  cfd::core::BlindFactor::BlindFactor(&local_10f0,(string *)&local_e00);
  cfd::ConfidentialTransactionContext::SetAssetReissuance
            ((OutPoint *)local_1160,(Amount *)local_c88,(IssuanceOutputParameter *)local_1738,
             (BlindFactor *)local_6f8,(BlindFactor *)local_a58);
  local_1118 = &PTR__ConfidentialAssetId_002dc170;
  if (local_1110 != (void *)0x0) {
    operator_delete(local_1110);
  }
  local_1160._32_8_ = &PTR__ConfidentialAssetId_002dc170;
  if (local_1138 != (void *)0x0) {
    operator_delete(local_1138);
  }
  local_1160._0_8_ = &PTR__BlindFactor_002dbf10;
  if ((pointer)local_1160._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1160._8_8_);
  }
  local_10f0._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_002dbf10;
  if (local_10f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_10f0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer *)
      local_e00.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_e00.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1738._0_8_ = &PTR__Txid_002dbe60;
  if ((void *)CONCAT71(local_1738._9_7_,local_1738[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1738._9_7_,local_1738[8]));
  }
  local_1738._0_8_ = &local_1728;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1738,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,"");
  cfd::core::ExtPubkey::ExtPubkey(&local_11d0,(string *)local_1738);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._0_8_ != &local_1728) {
    operator_delete((void *)local_1738._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((uint)local_1738);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::AddressFactory::CreateP2wpkhAddress((Pubkey *)&local_10f0);
  if ((pointer *)
      local_e00.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_e00.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_16e0 != (void *)0x0) {
    operator_delete(local_16e0);
  }
  if (local_16f8 != (void *)0x0) {
    operator_delete(local_16f8);
  }
  if (local_1710 != (void *)0x0) {
    operator_delete(local_1710);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_1738._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((uint)local_1738);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::AddressFactory::CreateP2wpkhAddress(&local_e00);
  if (local_f78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f78.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_16e0 != (void *)0x0) {
    operator_delete(local_16e0);
  }
  if (local_16f8 != (void *)0x0) {
    operator_delete(local_16f8);
  }
  if (local_1710 != (void *)0x0) {
    operator_delete(local_1710);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_1738._0_8_);
  }
  cfd::core::Amount::Amount((Amount *)local_1738,10000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_c88,(Amount *)&local_10f0,(ConfidentialAssetId *)local_1738);
  cfd::core::Amount::Amount((Amount *)local_1738,500000);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_c88,(Amount *)&local_e00,(ConfidentialAssetId *)local_1738);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)(local_17b8 + 0x18),&exp_dummy_asset_a);
  local_1768._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1768._M_impl.super__Rb_tree_header._M_header;
  local_1768._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1768._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1768._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1768._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1768._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount((Amount *)&local_f78,0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_1768,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1738,
             (Amount *)&local_f78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._0_8_ != &local_1728) {
    operator_delete((void *)local_1738._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount((Amount *)&local_f78,0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_1768,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1738,
             (Amount *)&local_f78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._0_8_ != &local_1728) {
    operator_delete((void *)local_1738._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((uint)local_1738);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::AddressFactory::CreateP2wpkhAddress(&local_f78);
  if (local_bd0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bd0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_16e0 != (void *)0x0) {
    operator_delete(local_16e0);
  }
  if (local_16f8 != (void *)0x0) {
    operator_delete(local_16f8);
  }
  if (local_1710 != (void *)0x0) {
    operator_delete(local_1710);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_1738._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((uint)local_1738);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::AddressFactory::CreateP2wpkhAddress(&local_bd0);
  if ((pointer)local_1808._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1808._0_8_);
  }
  if (local_16e0 != (void *)0x0) {
    operator_delete(local_16e0);
  }
  if (local_16f8 != (void *)0x0) {
    operator_delete(local_16f8);
  }
  if (local_1710 != (void *)0x0) {
    operator_delete(local_1710);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_1738._0_8_);
  }
  local_1200._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1200._M_impl.super__Rb_tree_header._M_header;
  local_1200._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1200._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1200._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1200._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_1200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1738,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808);
  if ((undefined1 *)local_1808._0_8_ != local_1808 + 0x10) {
    operator_delete((void *)local_1808._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._0_8_ != &local_1728) {
    operator_delete((void *)local_1738._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_1200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1738,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1808);
  if ((undefined1 *)local_1808._0_8_ != local_1808 + 0x10) {
    operator_delete((void *)local_1808._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1738._0_8_ != &local_1728) {
    operator_delete((void *)local_1738._0_8_);
  }
  cfd::UtxoData::UtxoData((UtxoData *)local_1738,local_568);
  local_1248._2_1_ = (bool)uStack_76;
  local_1248._0_2_ = local_78;
  local_1248._3_1_ = uStack_75;
  local_1248._4_4_ = uStack_74;
  cfd::core::Script::Script(&local_1240,&local_70);
  local_1208 = local_38;
  __l._M_len = 1;
  __l._M_array = (iterator)local_1738;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)local_17b8,__l,(allocator_type *)local_1808);
  cfd::core::Script::~Script(&local_1240);
  cfd::UtxoData::~UtxoData((UtxoData *)local_1738);
  cfd::core::Amount::Amount(local_1778);
  local_18b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_18b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)local_1738);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(0.1);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(0.1);
  cfd::CoinSelectionOption::SetFeeAsset((ConfidentialAssetId *)local_1738);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  cfd::api::ElementsTransactionApi::FundRawTransaction
            ((string *)local_1808,&local_18b9,(map *)&local_18e0,(vector *)&local_1898,
             (map *)&local_1768,(ConfidentialAssetId *)local_17b8,false,0.1,
             (Amount *)(local_17b8 + 0x18),(UtxoFilter *)CONCAT44(in_stack_ffffffffffffe6bc,1),
             (CoinSelectionOption *)local_1778,local_1854,(NetType)(ConfidentialAssetId *)local_1738
             ,(vector *)&local_18b8,(Amount *)CONCAT44(in_stack_ffffffffffffe6e4,4));
  if ((undefined1 *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) != local_18d0) {
    operator_delete((undefined1 *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_));
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_18f0,"kExpTxData","ctx.GetHex().c_str()",
             "0200000000030f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c34600000bfa8774c5f753ce2f801a8106413b470af94edbff5b4242ed4c5a26d20e72b90000000000ffffffff040b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff07010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b92700001976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac01cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c34600001976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0100000000000000000000000000000000000000000000000000000000000000aa010000000000989680001600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb01000000000007a120001600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa01000000000000036800000100000000000000000000000000000000000000000000000000000000000000bb010000000001124c1e00160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa0100000000004b57f60016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000"
             ,(char *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_));
  if ((undefined1 *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) != local_18d0) {
    operator_delete((undefined1 *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_));
  }
  if (local_18f0.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_18e0);
    if (local_18e8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_18e8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x275,pcVar6);
    testing::internal::AssertHelper::operator=(&local_18f8,&local_18e0);
    testing::internal::AssertHelper::~AssertHelper(&local_18f8);
    if (CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_18f8.data_._0_4_ = 0x368;
  local_18f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cfd::core::Amount::GetSatoshiValue();
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_18e0,"872","estimate_fee.GetSatoshiValue()",(int *)&local_18f8,
             (long *)&local_18f0);
  if (local_18e0.ss_.ptr_._0_1_ == (map)0x0) {
    testing::Message::Message((Message *)&local_18f0);
    if (local_18d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_18d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x276,pcVar6);
    testing::internal::AssertHelper::operator=(&local_18f8,(Message *)&local_18f0);
    testing::internal::AssertHelper::~AssertHelper(&local_18f8);
    if (local_18f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_18f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18f0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_18f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_18f8.data_ =
       (AssertHelperData *)
       ((long)local_18b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_18b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_18e0,"size_t{2}","append_txout_addresses.size()",
             (unsigned_long *)&local_18f0,(unsigned_long *)&local_18f8);
  if (local_18e0.ss_.ptr_._0_1_ == (map)0x0) {
    testing::Message::Message((Message *)&local_18f0);
    if (local_18d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_18d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x278,pcVar6);
    testing::internal::AssertHelper::operator=(&local_18f8,(Message *)&local_18f0);
    testing::internal::AssertHelper::~AssertHelper(&local_18f8);
    if (local_18f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_18f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18f0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long)local_18b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_18b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x40) {
    cfd::core::Address::GetAddress_abi_cxx11_();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_18f0,"addr1.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",
               (char *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_),
               local_18b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    if ((undefined1 *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) != local_18d0) {
      operator_delete((undefined1 *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_));
    }
    if (local_18f0.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message(&local_18e0);
      if (local_18e8.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((local_18e8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_18f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x27b,pcVar6);
      testing::internal::AssertHelper::operator=(&local_18f8,&local_18e0);
      testing::internal::AssertHelper::~AssertHelper(&local_18f8);
      if (CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           ((long *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) + 8))
                    ();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_18e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Address::GetAddress_abi_cxx11_();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_18f0,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",
               (char *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_),
               ((local_18b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    if ((undefined1 *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) != local_18d0) {
      operator_delete((undefined1 *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_));
    }
    if (local_18f0.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message(&local_18e0);
      if (local_18e8.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((local_18e8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_18f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x27c,pcVar6);
      testing::internal::AssertHelper::operator=(&local_18f8,&local_18e0);
      testing::internal::AssertHelper::~AssertHelper(&local_18f8);
      if (CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) != 0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           ((long *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_18e0.ss_.ptr_._1_7_,local_18e0.ss_.ptr_._0_1_) + 8))
                    ();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_18e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_1808._0_8_ = &PTR__ConfidentialTransactionController_002dbde8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)(local_1808 + 0x10));
  local_1700 = &PTR__ConfidentialAssetId_002dc170;
  if (local_16f8 != (void *)0x0) {
    operator_delete(local_16f8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_18b8);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)local_17b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1200);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a88);
  cfd::core::Script::~Script(&local_ac8);
  local_b58[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_ae0);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_b58);
  if (local_b70 != (void *)0x0) {
    operator_delete(local_b70);
  }
  if (local_b88 != (void *)0x0) {
    operator_delete(local_b88);
  }
  if (local_ba0 != (void *)0x0) {
    operator_delete(local_ba0);
  }
  if (local_bd0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != local_bb0) {
    operator_delete(local_bd0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e30);
  cfd::core::Script::~Script(&local_e70);
  local_f00[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_e88);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_f00);
  if (local_f18 != (void *)0x0) {
    operator_delete(local_f18);
  }
  if (local_f30 != (void *)0x0) {
    operator_delete(local_f30);
  }
  if (local_f48 != (void *)0x0) {
    operator_delete(local_f48);
  }
  if (local_f78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != local_f58) {
    operator_delete(local_f78.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&local_1768);
  local_17a0._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002dc170;
  if (local_17a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_17a0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_cb8);
  cfd::core::Script::~Script(&local_cf8);
  local_d88[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_d10);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_d88);
  if (local_da0 != (void *)0x0) {
    operator_delete(local_da0);
  }
  if (local_db8 != (void *)0x0) {
    operator_delete(local_db8);
  }
  if (local_dd0 != (void *)0x0) {
    operator_delete(local_dd0);
  }
  if (local_e00.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != local_de0) {
    operator_delete(local_e00.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_fa8);
  cfd::core::Script::~Script(&local_fe8);
  local_1078[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1000)
  ;
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_1078);
  if (local_1090 != (void *)0x0) {
    operator_delete(local_1090);
  }
  if (local_10a8 != (void *)0x0) {
    operator_delete(local_10a8);
  }
  if (local_10c0 != (void *)0x0) {
    operator_delete(local_10c0);
  }
  if (local_10f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != local_10d0) {
    operator_delete(local_10f0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  if (local_11d0.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11d0.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_11d0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11d0.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_11d0.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11d0.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_11d0.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11d0.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter((IssuanceOutputParameter *)local_a58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_598);
  cfd::core::Script::~Script(&local_5d8);
  local_668[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_5f0);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_668);
  if (local_680 != (void *)0x0) {
    operator_delete(local_680);
  }
  if (local_698 != (void *)0x0) {
    operator_delete(local_698);
  }
  if (local_6b0 != (void *)0x0) {
    operator_delete(local_6b0);
  }
  if (local_6d0 != local_6c0) {
    operator_delete(local_6d0);
  }
  if (local_1828[0] != local_1818) {
    operator_delete(local_1828[0]);
  }
  if (local_1878[0] != local_1868) {
    operator_delete(local_1878[0]);
  }
  local_1850[0] = &PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (local_1840);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_1898);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(local_c88);
  cfd::core::Script::~Script(&local_70);
  cfd::UtxoData::~UtxoData(local_568);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_Reissueasset) {
  static const char* const kExpTxData = "0200000000030f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c34600000bfa8774c5f753ce2f801a8106413b470af94edbff5b4242ed4c5a26d20e72b90000000000ffffffff040b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff07010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b92700001976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac01cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c34600001976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0100000000000000000000000000000000000000000000000000000000000000aa010000000000989680001600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb01000000000007a120001600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa01000000000000036800000100000000000000000000000000000000000000000000000000000000000000bb010000000001124c1e00160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa0100000000004b57f60016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000";

  ElementsUtxoAndOption input_utxo;
  ConfidentialTransactionContext tx(uint32_t{2}, uint32_t{0});
  std::vector<UtxoData> utxos;
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  std::string tokenAsset = "ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b";
  std::string descMulti = "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))";

  try {
    utxos.resize(kFundCoinSelectElementsTestVector.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      ++i;
    }

    // create reissue tx
    input_utxo.is_issuance = true;
    input_utxo.is_blind_issuance = true;
    input_utxo.utxo.txid = Txid("57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f");
    input_utxo.utxo.vout = 1;
    input_utxo.utxo.descriptor = descMulti;
    input_utxo.utxo.binary_data = nullptr;
    input_utxo.utxo.asset = ConfidentialAssetId(tokenAsset);
    input_utxo.utxo.asset_blind_factor =
      BlindFactor("0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8");
    input_utxo.utxo.amount_blind_factor =
      BlindFactor("62e36e1f0fa4916b031648a6b6903083069fa587572a88b729250cde528cfd3b");
    input_utxo.utxo.amount = Amount(int64_t{700000000});
    input_utxo.utxo.address_type = AddressType::kP2wshAddress;
    tx.AddInput(input_utxo.utxo);

    Address addr = factory.GetAddress("2djHX9wtrtdyGw9cer1u6zB6Yq4SRD8V5zw");
    tx.AddTxOut(addr, Amount(int64_t{700000000}), ConfidentialAssetId(tokenAsset));
    IssuanceOutputParameter reissue_data;
    reissue_data.address = factory.GetAddress("2dodsWJgP3pTWWidK5hDxuYHqC1U4CEnT3n");
    reissue_data.amount =  Amount(int64_t{600000000});
    // IssuanceParameter issue;
    tx.SetAssetReissuance(
        OutPoint(input_utxo.utxo.txid, input_utxo.utxo.vout), reissue_data.amount,
        reissue_data, input_utxo.utxo.asset_blind_factor,
        BlindFactor("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306"));
    // output.WriteLine("issue asset: " + issueAsset.ToHexString());

    // add txout
    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    Address set_addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(11).GetPubkey());
    Address set_addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(12).GetPubkey());
    tx.AddTxOut(set_addr1, Amount(int64_t{10000000}), exp_dummy_asset_a);
    tx.AddTxOut(set_addr2, Amount(int64_t{500000}), exp_dummy_asset_b);

    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{0}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{0}));
    Address addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(1).GetPubkey());
    Address addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(2).GetPubkey());
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    std::vector<ElementsUtxoAndOption> selected_txin_utxos = {input_utxo};
    double fee_rate = 0.1;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(fee_rate);
    option.SetFeeAsset(fee_asset);
    // option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);

    EXPECT_STREQ(kExpTxData, ctx.GetHex().c_str());
    EXPECT_EQ(872, estimate_fee.GetSatoshiValue());
    // EXPECT_EQ(657, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{2}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{2})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[1].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}